

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

string * ChecksumNameShort_abi_cxx11_
                   (string *__return_storage_ptr__,
                   set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *methods)

{
  bool bVar1;
  bool bVar2;
  reference pCVar3;
  ChecksumType *m;
  iterator __end1;
  iterator __begin1;
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *__range1;
  stringstream local_1a0 [7];
  bool first;
  stringstream ss;
  ostream local_190 [376];
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *local_18;
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *methods_local;
  
  local_18 = methods;
  methods_local =
       (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
       __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = true;
  __end1 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::begin
                     (methods);
  m = (ChecksumType *)
      std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::end(methods);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&m), bVar2) {
    pCVar3 = std::_Rb_tree_const_iterator<ChecksumType>::operator*(&__end1);
    if (!bVar1) {
      std::operator<<(local_190,"|");
    }
    bVar1 = false;
    switch(*pCVar3) {
    case None:
      std::operator<<(local_190,"none");
      break;
    case Constant_8C15:
      std::operator<<(local_190,"8C15");
      break;
    case Sum_1800:
      std::operator<<(local_190,"sum");
      break;
    case XOR_1800:
      std::operator<<(local_190,"xor");
      break;
    case XOR_18A0:
      std::operator<<(local_190,"xorA0");
      break;
    case CRC_D2F6_1800:
      std::operator<<(local_190,"crc0");
      break;
    case CRC_D2F6_1802:
      std::operator<<(local_190,"crc2");
    }
    std::_Rb_tree_const_iterator<ChecksumType>::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ChecksumNameShort(std::set<ChecksumType> methods)
{
    std::stringstream ss;
    bool first = true;

    for (auto& m : methods)
    {
        if (!first)
            ss << "|";
        first = false;

        switch (m)
        {
        case ChecksumType::None:            ss << "none"; break;
        case ChecksumType::Constant_8C15:   ss << "8C15"; break;
        case ChecksumType::Sum_1800:        ss << "sum"; break;
        case ChecksumType::XOR_1800:        ss << "xor"; break;
        case ChecksumType::XOR_18A0:        ss << "xorA0"; break;
        case ChecksumType::CRC_D2F6_1800:   ss << "crc0"; break;
        case ChecksumType::CRC_D2F6_1802:   ss << "crc2"; break;
        }
    }

    return ss.str();
}